

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_modify_passwords_file_ha1(char *fname,char *domain,char *user,char *ha1)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  size_t sVar6;
  FILE *pFVar7;
  size_t sVar8;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  bool bVar14;
  stat st;
  char d [256];
  char u [256];
  char h [256];
  char line [512];
  uint local_5ec;
  void *local_5e8;
  stat64 local_5c8;
  char local_538 [255];
  undefined1 local_439;
  char local_438 [255];
  undefined1 local_339;
  undefined1 local_338 [255];
  undefined1 local_239;
  char local_238 [520];
  
  memset(&local_5c8,0,0x90);
  pcVar13 = (char *)0x0;
  if ((ha1 != (char *)0x0) && (*ha1 != '\0')) {
    pcVar13 = ha1;
  }
  if (user == (char *)0x0 || (domain == (char *)0x0 || fname == (char *)0x0)) {
    return 0;
  }
  pcVar4 = strchr(user,0x3a);
  if (pcVar4 != (char *)0x0) {
    return 0;
  }
  pcVar4 = strchr(domain,0x3a);
  if (pcVar4 != (char *)0x0) {
    return 0;
  }
  uVar12 = 0;
  do {
    bVar1 = user[uVar12];
    if ((ulong)bVar1 == 0) goto LAB_0010fbc9;
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[bVar1] & 2) != 0) {
      return 0;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0xff);
  uVar12 = 0xff;
LAB_0010fbc9:
  if (user[uVar12 & 0xffffffff] != '\0') {
    return 0;
  }
  uVar12 = 0;
  do {
    bVar1 = domain[uVar12];
    if ((ulong)bVar1 == 0) goto LAB_0010fc16;
    ppuVar5 = __ctype_b_loc();
    if (((*ppuVar5)[bVar1] & 2) != 0) {
      return 0;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0xff);
  uVar12 = 0xff;
LAB_0010fc16:
  if (domain[uVar12 & 0xffffffff] != '\0') {
    return 0;
  }
  sVar6 = strlen(fname);
  if (0xfff < sVar6) {
    return 0;
  }
  iVar3 = stat64(fname,&local_5c8);
  if (iVar3 == 0) {
    uVar9 = 0;
    if (0xa00000 < local_5c8.st_size) {
      return 0;
    }
    local_5e8 = calloc((long)((int)local_5c8.st_size + 0x400),1);
    if (local_5e8 == (void *)0x0) {
      return 0;
    }
    pFVar7 = fopen64(fname,"r");
    if (pFVar7 != (FILE *)0x0) {
      local_5ec = 0;
      bVar10 = false;
LAB_0010fd81:
      do {
        pcVar4 = fgets(local_238,0x200,pFVar7);
        if ((pcVar4 == (char *)0x0) || ((int)local_5c8.st_size + 0x1a8 <= (int)local_5ec))
        goto LAB_0010feb3;
        iVar3 = __isoc99_sscanf(local_238,"%255[^:]:%255[^:]:%255s",local_438,local_538,local_338);
      } while (iVar3 != 3);
      local_339 = 0;
      local_439 = 0;
      local_239 = 0;
      iVar3 = strcmp(local_438,user);
      if ((iVar3 == 0) && (iVar3 = strcmp(local_538,domain), iVar3 == 0)) {
        bVar2 = true;
        bVar14 = pcVar13 == (char *)0x0 || bVar10;
        bVar10 = bVar2;
        if (bVar14) goto LAB_0010fd81;
        iVar3 = sprintf((char *)((ulong)local_5ec + (long)local_5e8),"%s:%s:%s\n",user,domain,
                        pcVar13);
      }
      else {
        iVar3 = sprintf((char *)((ulong)local_5ec + (long)local_5e8),"%s:%s:%s\n",local_438,
                        local_538,local_338);
        bVar2 = bVar10;
      }
      if (iVar3 < 1) {
        fclose(pFVar7);
        goto LAB_0010fed5;
      }
      local_5ec = local_5ec + iVar3;
      bVar10 = bVar2;
      goto LAB_0010fd81;
    }
    goto LAB_0010fcfe;
  }
  bVar10 = false;
  local_5e8 = (void *)0x0;
  sVar6 = 0;
LAB_0010fc54:
  pFVar7 = fopen64(fname,"w");
  if (pFVar7 == (FILE *)0x0) {
LAB_0010fed5:
    free(local_5e8);
    return 0;
  }
  iVar3 = fileno(pFVar7);
  iVar3 = fchmod(iVar3,0x180);
  uVar11 = (uint)(iVar3 == 0);
  if (((local_5e8 != (void *)0x0) && (0 < (int)sVar6)) &&
     (sVar8 = fwrite(local_5e8,1,sVar6,pFVar7), sVar8 != sVar6)) {
    uVar11 = 0;
  }
  if (pcVar13 != (char *)0x0 && !bVar10) {
    iVar3 = fprintf(pFVar7,"%s:%s:%s\n",user,domain,pcVar13);
    if (iVar3 < 6) {
      uVar11 = 0;
    }
  }
  iVar3 = fclose(pFVar7);
  uVar9 = 0;
  if (iVar3 == 0) {
    uVar9 = uVar11;
  }
LAB_0010fcfe:
  free(local_5e8);
  return uVar9;
LAB_0010feb3:
  fclose(pFVar7);
  sVar6 = (size_t)local_5ec;
  goto LAB_0010fc54;
}

Assistant:

CIVETWEB_API int
mg_modify_passwords_file_ha1(const char *fname,
                             const char *domain,
                             const char *user,
                             const char *ha1)
{
	int found = 0, i, result = 1;
	char line[512], u[256], d[256], h[256];
	struct stat st = {0};
	FILE *fp = NULL;
	char *temp_file = NULL;
	int temp_file_offs = 0;

	/* Regard empty password as no password - remove user record. */
	if ((ha1 != NULL) && (ha1[0] == '\0')) {
		ha1 = NULL;
	}

	/* Other arguments must not be empty */
	if ((fname == NULL) || (domain == NULL) || (user == NULL)) {
		return 0;
	}

	/* Using the given file format, user name and domain must not contain
	 * the ':' character */
	if (strchr(user, ':') != NULL) {
		return 0;
	}
	if (strchr(domain, ':') != NULL) {
		return 0;
	}

	/* Do not allow control characters like newline in user name and domain.
	 * Do not allow excessively long names either. */
	for (i = 0; ((i < 255) && (user[i] != 0)); i++) {
		if (iscntrl((unsigned char)user[i])) {
			return 0;
		}
	}
	if (user[i]) {
		return 0; /* user name too long */
	}
	for (i = 0; ((i < 255) && (domain[i] != 0)); i++) {
		if (iscntrl((unsigned char)domain[i])) {
			return 0;
		}
	}
	if (domain[i]) {
		return 0; /* domain name too long */
	}

	/* The maximum length of the path to the password file is limited */
	if (strlen(fname) >= UTF8_PATH_MAX) {
		return 0;
	}

	/* Check if the file exists, and get file size */
	if (0 == stat(fname, &st)) {
		int temp_buf_len;
		if (st.st_size > 10485760) {
			/* Some funster provided a >10 MB text file */
			return 0;
		}

		/* Add enough space for one more line */
		temp_buf_len = (int)st.st_size + 1024;

		/* Allocate memory (instead of using a temporary file) */
		temp_file = (char *)mg_calloc((size_t)temp_buf_len, 1);
		if (!temp_file) {
			/* Out of memory */
			return 0;
		}

		/* File exists. Read it into a memory buffer. */
		fp = fopen(fname, "r");
		if (fp == NULL) {
			/* Cannot read file. No permission? */
			mg_free(temp_file);
			return 0;
		}

		/* Read content and store in memory */
		while ((fgets(line, sizeof(line), fp) != NULL)
		       && ((temp_file_offs + 600) < temp_buf_len)) {
			/* file format is "user:domain:hash\n" */
			if (sscanf(line, "%255[^:]:%255[^:]:%255s", u, d, h) != 3) {
				continue;
			}
			u[255] = 0;
			d[255] = 0;
			h[255] = 0;

			if (!strcmp(u, user) && !strcmp(d, domain)) {
				/* Found the user: change the password hash or drop the user
				 */
				if ((ha1 != NULL) && (!found)) {
					i = sprintf(temp_file + temp_file_offs,
					            "%s:%s:%s\n",
					            user,
					            domain,
					            ha1);
					if (i < 1) {
						fclose(fp);
						mg_free(temp_file);
						return 0;
					}
					temp_file_offs += i;
				}
				found = 1;
			} else {
				/* Copy existing user, including password hash */
				i = sprintf(temp_file + temp_file_offs, "%s:%s:%s\n", u, d, h);
				if (i < 1) {
					fclose(fp);
					mg_free(temp_file);
					return 0;
				}
				temp_file_offs += i;
			}
		}
		fclose(fp);
	}

	/* Create new file */
	fp = fopen(fname, "w");
	if (!fp) {
		mg_free(temp_file);
		return 0;
	}

#if !defined(_WIN32)
	/* On Linux & co., restrict file read/write permissions to the owner */
	if (fchmod(fileno(fp), S_IRUSR | S_IWUSR) != 0) {
		result = 0;
	}
#endif

	if ((temp_file != NULL) && (temp_file_offs > 0)) {
		/* Store buffered content of old file */
		if (fwrite(temp_file, 1, (size_t)temp_file_offs, fp)
		    != (size_t)temp_file_offs) {
			result = 0;
		}
	}

	/* If new user, just add it */
	if ((ha1 != NULL) && (!found)) {
		if (fprintf(fp, "%s:%s:%s\n", user, domain, ha1) < 6) {
			result = 0;
		}
	}

	/* All data written */
	if (fclose(fp) != 0) {
		result = 0;
	}

	mg_free(temp_file);
	return result;
}